

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

rule * Rule_merge(rule *pA,rule *pB)

{
  rule **pprVar1;
  rule *pFirst;
  
  pprVar1 = &pFirst;
  pFirst = (rule *)0x0;
  while ((pA != (rule *)0x0 && (pB != (rule *)0x0))) {
    if (pA->iRule < pB->iRule) {
      *pprVar1 = pA;
      pprVar1 = &pA->next;
      pA = pA->next;
    }
    else {
      *pprVar1 = pB;
      pprVar1 = &pB->next;
      pB = pB->next;
    }
  }
  if (pA != (rule *)0x0) {
    pB = pA;
  }
  *pprVar1 = pB;
  return pFirst;
}

Assistant:

static struct rule *Rule_merge(struct rule *pA, struct rule *pB){
  struct rule *pFirst = 0;
  struct rule **ppPrev = &pFirst;
  while( pA && pB ){
    if( pA->iRule<pB->iRule ){
      *ppPrev = pA;
      ppPrev = &pA->next;
      pA = pA->next;
    }else{
      *ppPrev = pB;
      ppPrev = &pB->next;
      pB = pB->next;
    }
  }
  if( pA ){
    *ppPrev = pA;
  }else{
    *ppPrev = pB;
  }
  return pFirst;
}